

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void __thiscall LowererMD::GenerateTruncWithCheck<false>(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Opnd *compareSrc1;
  Opnd *this_00;
  IntConstOpnd *pIVar5;
  LabelInstr *target;
  ThreadContextInfo *this_01;
  intptr_t constAddr;
  RegOpnd *pRVar6;
  Instr *pIVar7;
  Opnd *tmp;
  Opnd *twoTo31;
  LabelInstr *skipUnsignedPart;
  Opnd *dst;
  Opnd *src64;
  LabelInstr *doneLabel;
  Instr *instr_local;
  LowererMD *this_local;
  
  BVar3 = AutoSystemInfo::SSE2Available(&AutoSystemInfo::Data);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x13a5,"(AutoSystemInfo::Data.SSE2Available())",
                       "AutoSystemInfo::Data.SSE2Available()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  compareSrc1 = GenerateTruncChecks<false>(this,instr,(LabelInstr *)0x0);
  this_00 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsUnsigned(this_00);
  if (bVar2) {
    pIVar5 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,false);
    Lowerer::InsertMove(this_00,&pIVar5->super_Opnd,instr,true);
    target = IR::LabelInstr::New(Label,this->m_func,false);
    this_01 = Func::GetThreadContextInfo(this->m_func);
    constAddr = ThreadContextInfo::GetDoubleTwoTo31Addr(this_01);
    pRVar6 = MaterializeDoubleConstFromInt(this,constAddr,instr);
    Lowerer::InsertCompareBranch
              (this->m_lowerer,compareSrc1,&pRVar6->super_Opnd,BrLt_A,target,instr,false);
    pIVar7 = IR::Instr::New(SUBPD,compareSrc1,compareSrc1,&pRVar6->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar7);
    pIVar5 = IR::IntConstOpnd::New(0x80000000,TyUint32,this->m_func,false);
    Lowerer::InsertMove(this_00,&pIVar5->super_Opnd,instr,true);
    IR::Instr::InsertBefore(instr,&target->super_Instr);
    pRVar6 = IR::RegOpnd::New(TyInt32,this->m_func);
    pIVar7 = IR::Instr::New(CVTTSD2SI,&pRVar6->super_Opnd,compareSrc1,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar7);
    pIVar7 = IR::Instr::New(ADD,this_00,this_00,&pRVar6->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar7);
  }
  else {
    pIVar7 = IR::Instr::New(CVTTSD2SI,this_00,compareSrc1,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar7);
  }
  IR::Instr::UnlinkSrc1(instr);
  IR::Instr::UnlinkDst(instr);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
LowererMD::GenerateTruncWithCheck(_In_ IR::Instr * instr)
{
    Assert(AutoSystemInfo::Data.SSE2Available());

    IR::LabelInstr * doneLabel = Saturate ? IR::LabelInstr::New(Js::OpCode::Label, m_func) : nullptr;
    IR::Opnd* src64 = GenerateTruncChecks<Saturate>(instr, doneLabel); //converts src to double and checks if  MIN <= src <= MAX

    IR::Opnd* dst = instr->GetDst();

    if (dst->IsUnsigned())
    {
        m_lowerer->InsertMove(dst, IR::IntConstOpnd::New(0, TyUint32, m_func), instr);
        IR::LabelInstr * skipUnsignedPart = IR::LabelInstr::New(Js::OpCode::Label, m_func);
        IR::Opnd* twoTo31 = MaterializeDoubleConstFromInt(m_func->GetThreadContextInfo()->GetDoubleTwoTo31Addr(), instr);
        m_lowerer->InsertCompareBranch(src64, twoTo31, Js::OpCode::BrLt_A, skipUnsignedPart, instr);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::SUBPD, src64, src64, twoTo31, m_func));
        m_lowerer->InsertMove(dst, IR::IntConstOpnd::New(0x80000000 /*2^31*/, TyUint32, m_func), instr);
        instr->InsertBefore(skipUnsignedPart);
        IR::Opnd* tmp = IR::RegOpnd::New(TyInt32, m_func);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::CVTTSD2SI, tmp, src64, m_func));
        instr->InsertBefore(IR::Instr::New(Js::OpCode::ADD, dst, dst, tmp, m_func));
    }
    else
    {
        instr->InsertBefore(IR::Instr::New(Js::OpCode::CVTTSD2SI, dst, src64, m_func));
    }
    if (Saturate)
    {
        instr->InsertBefore(doneLabel);
    }
    instr->UnlinkSrc1();
    instr->UnlinkDst();
    instr->Remove();
}